

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  cmStateSnapshot *this_00;
  cmListFileBacktrace *this_01;
  _Alloc_hider filename;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  cmMessenger *messenger;
  iterator iVar4;
  pointer pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string name;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  cmListFile listFile;
  string currentStart;
  string filesDir;
  BuildsystemFileScope scope;
  value_type local_158;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  Entry *local_108;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> vStack_100;
  cmListFile local_e8;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  _Base_ptr local_88 [2];
  undefined1 local_78 [16];
  BuildsystemFileScope local_68;
  
  this_00 = &this->StateSnapshot;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_128,this_00);
  pcVar3 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_128);
  std::__cxx11::string::string((string *)&local_c8,pcVar3,(allocator *)(local_78 + 0x10));
  std::__cxx11::string::append((char *)&local_c8);
  this_01 = &this->Backtrace;
  cmListFileBacktrace::Push((cmListFileBacktrace *)local_128,this_01,&local_c8);
  cmListFileBacktrace::operator=(this_01,(cmListFileBacktrace *)local_128);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_128);
  BuildsystemFileScope::BuildsystemFileScope((BuildsystemFileScope *)(local_78 + 0x10),this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_128,this_00);
  pcVar3 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)local_128);
  std::__cxx11::string::string((string *)local_88,pcVar3,(allocator *)&local_158);
  std::__cxx11::string::append((char *)local_88);
  cmsys::SystemTools::MakeDirectory((char *)local_88[0]);
  bVar1 = cmsys::SystemTools::FileExists(local_c8._M_dataplus._M_p,true);
  if (!bVar1) {
    __assert_fail("cmSystemTools::FileExists(currentStart.c_str(), true)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmMakefile.cxx"
                  ,0x57a,"void cmMakefile::Configure()");
  }
  local_128._0_8_ = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CMAKE_PARENT_LIST_FILE","");
  AddDefinition(this,(string *)local_128,local_c8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._0_8_ != &local_118) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
  }
  filename._M_p = local_c8._M_dataplus._M_p;
  local_e8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (cmListFileFunction *)0x0;
  local_e8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (cmListFileFunction *)0x0;
  local_e8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  messenger = cmake::GetMessenger(this->GlobalGenerator->CMakeInstance);
  bVar1 = cmListFile::ParseFile(&local_e8,filename._M_p,messenger,this_01);
  if (!bVar1) goto LAB_0027ffb6;
  cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_128,this_00);
  bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_128);
  if (!bVar1) {
    if (local_e8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar5 = local_e8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::LowerCase((string *)local_128,(string *)pcVar5);
        iVar2 = std::__cxx11::string::compare((char *)local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ != &local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
        }
        if (iVar2 == 0) goto LAB_0027fdb3;
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 != local_e8.Functions.
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((ulong)((long)local_e8.Functions.
                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_e8.Functions.
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 0x780) {
      local_118._8_8_ = local_128 + 8;
      local_128._8_8_ = local_128._8_8_ & 0xffffffff00000000;
      local_118._M_allocated_capacity = 0;
      vStack_100.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      paVar6 = &local_158.Value.field_2;
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      local_108 = (Entry *)local_118._8_8_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"project","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"set","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"if","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"endif","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"else","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"elseif","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"add_executable","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"add_library","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"target_link_libraries","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"option","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      local_158.Value._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"message","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_128,&local_158.Value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.Value._M_dataplus._M_p != paVar6) {
        operator_delete(local_158.Value._M_dataplus._M_p,
                        local_158.Value.field_2._M_allocated_capacity + 1);
      }
      if (local_e8.Functions.
          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_e8.Functions.
          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_128);
      }
      else {
        bVar1 = false;
        pcVar5 = local_e8.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        do {
          cmsys::SystemTools::LowerCase(&local_158.Value,(string *)pcVar5);
          iVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_128,&local_158.Value);
          if (iVar4._M_node == (_Base_ptr)(local_128 + 8)) {
            bVar1 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.Value._M_dataplus._M_p != &local_158.Value.field_2) {
            operator_delete(local_158.Value._M_dataplus._M_p,
                            local_158.Value.field_2._M_allocated_capacity + 1);
          }
        } while ((iVar4._M_node != (_Base_ptr)(local_128 + 8)) &&
                (pcVar5 = pcVar5 + 1,
                pcVar5 != local_e8.Functions.
                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                          ._M_impl.super__Vector_impl_data._M_finish));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_128);
        if (bVar1) goto LAB_0027fd91;
      }
    }
    else {
LAB_0027fd91:
      this->CheckCMP0000 = true;
      cmPolicies::ApplyPolicyVersion(this,"2.4");
    }
LAB_0027fdb3:
    if (local_e8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar5 = local_e8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::LowerCase((string *)local_128,(string *)pcVar5);
        iVar2 = std::__cxx11::string::compare((char *)local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ != &local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
        }
        if (iVar2 == 0) goto LAB_0027ff21;
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 != local_e8.Functions.
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_128._0_8_ = &local_118;
    local_128._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_118._M_allocated_capacity = local_118._M_allocated_capacity & 0xffffffffffffff00;
    local_108 = (Entry *)0x0;
    vStack_100.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_100.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_100.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)local_128,0,(char *)0x0,0x57e52c);
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Project","");
    paVar6 = &local_158.Value.field_2;
    local_158.Value._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_a8,local_a0 + (long)local_a8);
    local_158.Delim = Unquoted;
    local_158.Line = 0;
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
              (&vStack_100,&local_158);
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
              (&local_e8.Functions,
               (const_iterator)
               local_e8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start,(value_type *)local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.Value._M_dataplus._M_p != paVar6) {
      operator_delete(local_158.Value._M_dataplus._M_p,
                      local_158.Value.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&vStack_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ != &local_118) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_118._M_allocated_capacity + 1));
    }
  }
LAB_0027ff21:
  ReadListFile(this,&local_e8,&local_c8);
  if ((cmSystemTools::s_FatalErrorOccured != false) ||
     (bVar1 = cmSystemTools::GetInterruptFlag(), bVar1)) {
    local_68.ReportError = false;
  }
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_128,
             &this->UnConfiguredDirectories);
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_128._0_8_;
  if (local_128._0_8_ != local_128._8_8_) {
    do {
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand
                ((cmStateSnapshot *)(paVar6->_M_allocated_capacity + 0x260));
      ConfigureSubDirectory(this,(cmMakefile *)paVar6->_M_allocated_capacity);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar6 + 8);
    } while (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_128._8_8_);
  }
  AddCMakeDependFilesFromUser(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity - local_128._0_8_);
  }
LAB_0027ffb6:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_e8.Functions)
  ;
  if (local_88[0] != (_Base_ptr)local_78) {
    operator_delete(local_88[0],local_78._0_8_ + 1);
  }
  BuildsystemFileScope::~BuildsystemFileScope((BuildsystemFileScope *)(local_78 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart =
    this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace = this->Backtrace.Push(currentStart);

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(filesDir.c_str());

  assert(cmSystemTools::FileExists(currentStart.c_str(), true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (std::vector<cmListFileFunction>::iterator i =
           listFile.Functions.begin();
         i != listFile.Functions.end(); ++i) {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (std::vector<cmListFileFunction>::iterator i =
               listFile.Functions.begin();
             i != listFile.Functions.end(); ++i) {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end()) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        this->SetPolicyVersion("2.4");
      }
    }
    bool hasProject = false;
    // search for a project command
    for (std::vector<cmListFileFunction>::iterator i =
           listFile.Functions.begin();
         i != listFile.Functions.end(); ++i) {
      if (cmSystemTools::LowerCase(i->Name) == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->ReadListFile(listFile, currentStart);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}